

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

uint8_t absl::lts_20250127::strings_internal::CordTestAccess::LengthToTag(size_t s)

{
  uint8_t uVar1;
  AlphaNum *in_RCX;
  string local_b0;
  string death_message;
  AlphaNum local_70;
  string_view local_40 [3];
  
  if (s < 0xff4) {
    uVar1 = cord_internal::AllocatedSizeToTag(s + 0xd);
    return uVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&death_message,"Check s <= kMaxFlatLength failed: ",
             (allocator<char> *)local_40);
  local_40[0] = NullSafeStringView("Invalid length ");
  AlphaNum::AlphaNum(&local_70,s);
  StrCat_abi_cxx11_(&local_b0,(lts_20250127 *)local_40,&local_70,in_RCX);
  std::__cxx11::string::append((string *)&death_message);
  std::__cxx11::string::~string((string *)&local_b0);
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
             ,0x622,&death_message);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x622,"static uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t)")
  ;
}

Assistant:

uint8_t CordTestAccess::LengthToTag(size_t s) {
  ABSL_INTERNAL_CHECK(s <= kMaxFlatLength, absl::StrCat("Invalid length ", s));
  return cord_internal::AllocatedSizeToTag(s + cord_internal::kFlatOverhead);
}